

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeNdPoints.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  vector<float,_std::allocator<float>_> local_80;
  vector<float,_std::allocator<float>_> local_58;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<float,_std::allocator<float>_> pt;
  int M;
  int n;
  char **argv_local;
  int argc_local;
  
  pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 10;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cerr,"Must include a number!!\n");
  }
  else {
    pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = atoi(argv[1]);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_38);
    for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
      CreateRandomPoint(&local_58,
                        pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<float,_std::allocator<float>_>::operator=
                ((vector<float,_std::allocator<float>_> *)local_38,&local_58);
      std::vector<float,_std::allocator<float>_>::~vector(&local_58);
      std::vector<float,_std::allocator<float>_>::vector
                (&local_80,(vector<float,_std::allocator<float>_> *)local_38);
      print(&local_80);
      std::vector<float,_std::allocator<float>_>::~vector(&local_80);
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_38);
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	
    int n; // dimension of the point space
	const int M = 10; //number of points to generate
    
    if( argc < 2)
    {
        std::cerr<< "Must include a number!!\n";
        return 0;
    }
    n = std::atoi( argv[1] );
	
	//create list of M random points
	std::vector<numType> pt;
	for(auto i=0; i < M ; i++)
	{
		pt = CreateRandomPoint(n);
		print( pt );	
	}
}